

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O3

void dxil_spv::emit_instrumentation_hash
               (SPIRVModule *module,InstructionInstrumentationState *instrumentation,Function *func,
               Id value_id,Id instruction_id)

{
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  ulong uVar2;
  Function *pFVar3;
  Block *pBVar4;
  Block *elseBlock;
  Id IVar5;
  Builder *this;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  uint *puVar11;
  uint uVar12;
  pointer *__ptr;
  Id IVar13;
  iterator iVar14;
  _Head_base<0UL,_spv::Instruction_*,_false> local_b8;
  InstructionInstrumentationState *local_b0;
  uint local_a4;
  Instruction *local_a0;
  Instruction *local_98;
  Function *local_90;
  Instruction *local_88;
  Block *local_80;
  Instruction *local_78;
  Block *local_70;
  Id local_64;
  Instruction *local_60;
  Instruction *local_58;
  Instruction *local_50;
  Instruction *local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (Instruction *)CONCAT44(local_98._4_4_,instruction_id);
  local_b0 = instrumentation;
  local_a4 = value_id;
  this = SPIRVModule::get_builder(module);
  local_80 = (Block *)allocate_in_thread(0x78);
  IVar13 = this->uniqueId + 1;
  this->uniqueId = IVar13;
  local_80->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  pVVar1 = &local_80->instructions;
  (local_80->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80->parent = func;
  local_80->unreachable = false;
  local_90 = func;
  local_b8._M_head_impl = (Instruction *)allocate_in_thread(0x38);
  (local_b8._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  (local_b8._M_head_impl)->resultId = IVar13;
  (local_b8._M_head_impl)->typeId = 0;
  (local_b8._M_head_impl)->opCode = OpLabel;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_b8._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)pVVar1,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b8);
  if (local_b8._M_head_impl != (Instruction *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_Instruction[1])();
  }
  pFVar3 = local_90;
  ((local_80->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_80;
  spv::Module::mapInstruction
            (local_90->parent,
             (local_80->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  local_70 = (Block *)allocate_in_thread(0x78);
  IVar13 = this->uniqueId + 1;
  this->uniqueId = IVar13;
  local_70->_vptr_Block = (_func_int **)&PTR__Block_001f3cc8;
  pVVar1 = &local_70->instructions;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->predecessors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->successors).
  super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_70->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70->parent = pFVar3;
  local_70->unreachable = false;
  local_b8._M_head_impl = (Instruction *)allocate_in_thread(0x38);
  (local_b8._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  (local_b8._M_head_impl)->resultId = IVar13;
  (local_b8._M_head_impl)->typeId = 0;
  (local_b8._M_head_impl)->opCode = OpLabel;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_b8._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_b8._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)pVVar1,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b8);
  if (local_b8._M_head_impl != (Instruction *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_Instruction[1])();
  }
  ((local_70->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_70;
  spv::Module::mapInstruction
            (local_90->parent,
             (local_70->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar5 = spv::Builder::makeBoolType(this);
  local_a0 = (Instruction *)CONCAT44(local_a0._4_4_,IVar5);
  pIVar6 = spv::Builder::addInstruction(this,IVar13,OpIMul);
  pIVar7 = spv::Builder::addInstruction(this,IVar13,OpBitwiseXor);
  local_b8._M_head_impl._0_4_ = (uint)local_98;
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_98;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar5,0x61,false);
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar6->resultId;
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_40 = (local_b0->info).shader_hash;
  local_38 = local_40 >> 0x20;
  uVar12 = (uint)local_40;
  uVar2 = local_40 >> 0x20;
  IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar5,(uint)uVar2 ^ uVar12,false)
  ;
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_60 = pIVar7;
  if (local_a4 == 0) {
    pIVar6 = spv::Builder::addInstruction(this,IVar13,OpArrayLength);
    local_b8._M_head_impl._0_4_ = local_b0->global_nan_inf_control_var_id;
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
      iVar14._M_current =
           (pIVar6->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar11 = (pIVar6->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      iVar14._M_current = iVar14._M_current + 1;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current;
    }
    local_b8._M_head_impl._0_4_ = 0;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = 0;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    pIVar8 = spv::Builder::addInstruction(this,IVar13,OpISub);
    local_b8._M_head_impl._0_4_ = pIVar6->resultId;
    iVar14._M_current =
         (pIVar8->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (pIVar8->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar8->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar5,2,false);
    iVar14._M_current =
         (pIVar8->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (pIVar8->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar8->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    IVar5 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar13);
    pIVar6 = spv::Builder::addInstruction(this,IVar5,OpAccessChain);
    local_b8._M_head_impl._0_4_ = local_b0->global_nan_inf_control_var_id;
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (pIVar6->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar5,0,false);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
      iVar14._M_current =
           (pIVar6->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar11 = (pIVar6->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      iVar14._M_current = iVar14._M_current + 1;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current;
    }
    local_b8._M_head_impl._0_4_ = pIVar8->resultId;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    pIVar8 = spv::Builder::addInstruction(this,IVar13,OpLoad);
    local_b8._M_head_impl._0_4_ = pIVar6->resultId;
    iVar14._M_current =
         (pIVar8->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (pIVar8->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar8->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    uVar12 = pIVar8->resultId;
    pIVar6 = spv::Builder::addInstruction(this,IVar13,OpIMul);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a4 = uVar12;
    local_b8._M_head_impl._0_4_ = uVar12;
    if (iVar14._M_current ==
        (pIVar6->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = uVar12;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
    local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar5,0xc881,false);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        (pIVar6->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar6->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
    local_60 = spv::Builder::addInstruction(this,IVar13,OpBitwiseXor);
    local_b8._M_head_impl._0_4_ = pIVar7->resultId;
    iVar14._M_current =
         (local_60->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (local_60->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_60->operands,iVar14,(uint *)&local_b8);
      iVar14._M_current =
           (local_60->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar11 = (local_60->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      iVar14._M_current = iVar14._M_current + 1;
      (local_60->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current;
    }
    local_b8._M_head_impl._0_4_ = pIVar6->resultId;
    if (iVar14._M_current == puVar11) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_60->operands,iVar14,(uint *)&local_b8);
    }
    else {
      *iVar14._M_current = (uint)local_b8._M_head_impl;
      (local_60->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar14._M_current + 1;
    }
  }
  pIVar6 = spv::Builder::addInstruction(this,IVar13,OpArrayLength);
  pIVar7 = spv::Builder::addInstruction(this,IVar13,OpISub);
  pIVar8 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_98 = spv::Builder::addInstruction(this,IVar13,OpShiftRightLogical);
  local_88 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_78 = spv::Builder::addInstruction(this,IVar13,OpShiftLeftLogical);
  IVar5 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar13);
  local_50 = spv::Builder::addInstruction(this,IVar5,OpAccessChain);
  pIVar9 = spv::Builder::addInstruction(this,IVar13,OpAtomicOr);
  local_64 = IVar13;
  local_48 = spv::Builder::addInstruction(this,IVar13,OpBitwiseAnd);
  local_a0 = spv::Builder::addInstruction(this,(Id)local_a0,OpIEqual);
  local_58 = spv::Builder::addInstruction(this,OpStore);
  local_b8._M_head_impl._0_4_ = local_b0->global_nan_inf_data_var_id;
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar6->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = 0;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = 0;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar6->resultId;
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = local_60->resultId;
  iVar14._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar8->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar8->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar8->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = pIVar7->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pIVar7 = local_78;
  pIVar6 = local_98;
  local_b8._M_head_impl._0_4_ = pIVar8->resultId;
  iVar14._M_current =
       (local_98->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = (Instruction *)CONCAT44(local_78._4_4_,(uint)local_b8._M_head_impl);
  if (iVar14._M_current ==
      (local_98->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_98->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (local_98->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,4,false);
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pIVar6 = local_88;
  local_b8._M_head_impl._0_4_ = pIVar8->resultId;
  iVar14._M_current =
       (local_88->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (local_88->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &local_88->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (local_88->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pIVar8 = local_58;
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0xf,false);
  pIVar10 = local_48;
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar7->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar7->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  pIVar6 = local_50;
  local_b8._M_head_impl._0_4_ = local_88->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = local_b0->global_nan_inf_control_var_id;
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar6->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = local_98->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar6->resultId;
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar9->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar9->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = pIVar7->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar9->resultId;
  iVar14._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar10->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar10->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar10->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  pIVar9 = local_a0;
  local_b8._M_head_impl._0_4_ = pIVar7->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar10->resultId;
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = local_b0->should_report_instrumentation_id;
  iVar14._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = spv::Builder::makeBoolConstant(this,false,false);
  iVar14._M_current =
       (pIVar8->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar8->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar8->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar8->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  elseBlock = local_70;
  IVar13 = pIVar9->resultId;
  local_a0 = (Instruction *)CONCAT44(local_a0._4_4_,pIVar7->resultId);
  local_98 = (Instruction *)CONCAT44(local_98._4_4_,pIVar6->resultId);
  spv::Builder::createSelectionMerge(this,local_70,0);
  pBVar4 = local_80;
  spv::Builder::createConditionalBranch(this,IVar13,local_80,elseBlock);
  IVar13 = local_64;
  this->buildPoint = pBVar4;
  IVar5 = spv::Builder::makeVectorType(this,local_64,4);
  pIVar6 = spv::Builder::addInstruction(this,IVar5,OpCompositeConstruct);
  local_80 = (Block *)spv::Builder::addInstruction(this,IVar13,OpShiftLeftLogical);
  IVar5 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar5);
  pIVar7 = spv::Builder::addInstruction(this,IVar5,OpAccessChain);
  pIVar8 = spv::Builder::addInstruction(this,OpStore);
  local_88 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  pIVar9 = spv::Builder::addInstruction(this,IVar13,OpAtomicOr);
  pIVar10 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,(uint)local_40,false);
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar6->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,(uint)local_38,false);
  iVar14._M_current =
       (pIVar6->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar6->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ =
       (local_90->parameterInstructions).
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_start[1]->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar6->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar6->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = local_a4;
  local_90 = (Function *)pIVar8;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar6->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = local_a4;
    (pIVar6->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pBVar4 = local_80;
  local_b8._M_head_impl._0_4_ = (Id)local_a0;
  iVar14._M_current =
       (((Vector<Id> *)((long)local_80 + 0x18))->
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (((Vector<Id> *)((long)local_80 + 0x18))->
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)local_80 + 0x18),iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (Id)local_a0;
    (((Vector<Id> *)((long)local_80 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x10,false);
  iVar14._M_current =
       (((Vector<Id> *)((long)pBVar4 + 0x18))->
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (((Vector<Id> *)((long)pBVar4 + 0x18))->
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)pBVar4 + 0x18),iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (((Vector<Id> *)((long)pBVar4 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = local_b0->global_nan_inf_data_var_id;
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pFVar3 = local_90;
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar7->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar7->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar7->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = (uint)local_78;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_78;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = pIVar7->resultId;
  iVar14._M_current =
       (((Vector<Id> *)((long)pFVar3 + 0x18))->
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (((Vector<Id> *)((long)pFVar3 + 0x18))->
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)pFVar3 + 0x18),iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (((Vector<Id> *)((long)pFVar3 + 0x18))->
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (((Vector<Id> *)((long)pFVar3 + 0x18))->
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (((Vector<Id> *)((long)pFVar3 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  pIVar7 = local_88;
  local_b8._M_head_impl._0_4_ = pIVar6->resultId;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)pFVar3 + 0x18),iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (((Vector<Id> *)((long)pFVar3 + 0x18))->
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x48,false);
  iVar14._M_current =
       (pIVar7->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar7->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar7->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar7->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0x48,false);
  iVar14._M_current =
       (pIVar10->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar10->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar10->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar10->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  local_b8._M_head_impl._0_4_ = (uint)local_98;
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_98;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,1,false);
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (pIVar9->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  IVar13 = spv::Builder::makeIntegerType(this,0x20,false);
  local_b8._M_head_impl._0_4_ = spv::Builder::makeIntConstant(this,IVar13,0,false);
  iVar14._M_current =
       (pIVar9->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar11 = (pIVar9->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
    iVar14._M_current =
         (pIVar9->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar11 = (pIVar9->operands).
              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar14._M_current = (uint)local_b8._M_head_impl;
    iVar14._M_current = iVar14._M_current + 1;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current;
  }
  local_b8._M_head_impl._0_4_ = *(Id *)&local_80->instructions;
  if (iVar14._M_current == puVar11) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar9->operands,iVar14,(uint *)&local_b8);
  }
  else {
    *iVar14._M_current = *(Id *)&local_80->instructions;
    (pIVar9->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  pBVar4 = local_70;
  spv::Builder::createBranch(this,local_70);
  this->buildPoint = pBVar4;
  return;
}

Assistant:

void emit_instrumentation_hash(SPIRVModule &module, const InstructionInstrumentationState &instrumentation,
                               spv::Function *func, spv::Id value_id, spv::Id instruction_id)
{
	auto &builder = module.get_builder();
	auto *write_payload_path = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_payload_path = new spv::Block(builder.getUniqueId(), *func);

	spv::Id u32_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	auto *prime_mul = builder.addInstruction(u32_type, spv::OpIMul);
	auto *hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);

	prime_mul->addIdOperand(instruction_id);
	prime_mul->addIdOperand(builder.makeUintConstant(97)); // Arbitrary prime number

	hash->addIdOperand(prime_mul->getResultId());
	auto shader_hash = instrumentation.info.shader_hash;
	hash->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash) ^ uint32_t(shader_hash >> 32)));

	if (!value_id)
	{
		// For AssumeTrue instrumentation, we're more interested in the dispatch ID.
		// We've reserved space for it in the second last u32 of the control buffer.
		auto *len = builder.addInstruction(u32_type, spv::OpArrayLength);
		len->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		len->addImmediateOperand(0);

		auto *len_minus_2 = builder.addInstruction(u32_type, spv::OpISub);
		len_minus_2->addIdOperand(len->getResultId());
		len_minus_2->addIdOperand(builder.makeUintConstant(2));

		auto *cookie_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassStorageBuffer, u32_type), spv::OpAccessChain);
		cookie_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		cookie_chain->addIdOperand(builder.makeUintConstant(0));
		cookie_chain->addIdOperand(len_minus_2->getResultId());

		auto *load = builder.addInstruction(u32_type, spv::OpLoad);
		load->addIdOperand(cookie_chain->getResultId());
		value_id = load->getResultId();

		auto *mul = builder.addInstruction(u32_type, spv::OpIMul);
		mul->addIdOperand(value_id);
		mul->addIdOperand(builder.makeUintConstant(51329u));

		// Allow each dispatch to report their own faults.
		auto *ext_hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);
		ext_hash->addIdOperand(hash->getResultId());
		ext_hash->addIdOperand(mul->getResultId());

		hash = ext_hash;
	}

	auto *payload_size = builder.addInstruction(u32_type, spv::OpArrayLength);
	auto *sub_1 = builder.addInstruction(u32_type, spv::OpISub);
	auto *mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_word = builder.addInstruction(u32_type, spv::OpShiftRightLogical);
	auto *control_bit = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_mask = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
	auto *access_chain = builder.addInstruction(
	    builder.makePointer(spv::StorageClassStorageBuffer, u32_type),
	    spv::OpAccessChain);
	auto *atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
	auto *atomic_result_mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *atomic_need_write = builder.addInstruction(bool_type, spv::OpIEqual);
	auto *store_op = builder.addInstruction(spv::OpStore);

	payload_size->addIdOperand(instrumentation.global_nan_inf_data_var_id);
	payload_size->addImmediateOperand(0);
	sub_1->addIdOperand(payload_size->getResultId());
	sub_1->addIdOperand(builder.makeUintConstant(1));
	mask->addIdOperand(hash->getResultId());
	mask->addIdOperand(sub_1->getResultId());
	spv::Id mask_id = mask->getResultId();

	control_word->addIdOperand(mask->getResultId());
	control_word->addIdOperand(builder.makeUintConstant(4));
	control_bit->addIdOperand(mask->getResultId());
	control_bit->addIdOperand(builder.makeUintConstant(15));
	control_mask->addIdOperand(builder.makeUintConstant(1));
	control_mask->addIdOperand(control_bit->getResultId());

	access_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
	access_chain->addIdOperand(builder.makeUintConstant(0));
	access_chain->addIdOperand(control_word->getResultId());

	atomic_or->addIdOperand(access_chain->getResultId());
	atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_or->addIdOperand(builder.makeUintConstant(0));
	atomic_or->addIdOperand(control_mask->getResultId());

	atomic_result_mask->addIdOperand(atomic_or->getResultId());
	atomic_result_mask->addIdOperand(control_mask->getResultId());
	atomic_need_write->addIdOperand(atomic_result_mask->getResultId());
	atomic_need_write->addIdOperand(builder.makeUintConstant(0));

	store_op->addIdOperand(instrumentation.should_report_instrumentation_id);
	store_op->addIdOperand(builder.makeBoolConstant(false));

	spv::Id cond_id = atomic_need_write->getResultId();
	spv::Id control_mask_id = control_mask->getResultId();
	spv::Id control_chain_id = access_chain->getResultId();

	builder.createSelectionMerge(merge_payload_path, 0);
	builder.createConditionalBranch(cond_id, write_payload_path, merge_payload_path);
	builder.setBuildPoint(write_payload_path);
	{
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);

		auto *composite = builder.addInstruction(uvec4_type, spv::OpCompositeConstruct);
		auto *shift_16 = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
		access_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassStorageBuffer, uvec4_type),
			spv::OpAccessChain);
		store_op = builder.addInstruction(spv::OpStore);
		auto *barrier_op = builder.addInstruction(spv::OpMemoryBarrier);
		atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
		// Important this comes after the atomic or.
		auto *barrier_op2 = builder.addInstruction(spv::OpMemoryBarrier);

		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 0)));
		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 32)));
		composite->addIdOperand(func->getParamId(1));
		composite->addIdOperand(value_id);

		shift_16->addIdOperand(control_mask_id);
		shift_16->addIdOperand(builder.makeUintConstant(16));

		access_chain->addIdOperand(instrumentation.global_nan_inf_data_var_id);
		access_chain->addIdOperand(builder.makeUintConstant(0));
		access_chain->addIdOperand(mask_id);

		store_op->addIdOperand(access_chain->getResultId());
		store_op->addIdOperand(composite->getResultId());

		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                  spv::MemorySemanticsAcquireReleaseMask));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                   spv::MemorySemanticsAcquireReleaseMask));

		atomic_or->addIdOperand(control_chain_id);
		atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_or->addIdOperand(builder.makeUintConstant(0));
		atomic_or->addIdOperand(shift_16->getResultId());

		builder.createBranch(merge_payload_path);
	}
	builder.setBuildPoint(merge_payload_path);
}